

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IRContext::ProcessEntryPointCallTree(IRContext *this,ProcessFunction *pfn)

{
  bool bVar1;
  uint32_t local_9c;
  Instruction *local_98;
  Instruction *e;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  ProcessFunction *pfn_local;
  IRContext *this_local;
  
  roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)pfn;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)&__range2)
  ;
  module(this);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&e);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&e);
    if (!bVar1) break;
    local_98 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    local_9c = opt::Instruction::GetSingleWordInOperand(local_98,1);
    std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &__range2,&local_9c);
    InstructionList::iterator::operator++(&__end2);
  }
  bVar1 = ProcessCallTreeFromRoots
                    (this,(ProcessFunction *)
                          roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node,
                     (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&__range2);
  std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~queue
            ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &__range2);
  return bVar1;
}

Assistant:

bool IRContext::ProcessEntryPointCallTree(ProcessFunction& pfn) {
  // Collect all of the entry points as the roots.
  std::queue<uint32_t> roots;
  for (auto& e : module()->entry_points()) {
    roots.push(e.GetSingleWordInOperand(kEntryPointFunctionIdInIdx));
  }
  return ProcessCallTreeFromRoots(pfn, &roots);
}